

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils-inl.hpp
# Opt level: O1

int CoreMLConverter::getLayerIndex
              (LayerParameter *caffeLayer,
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *mapCaffeLayerNamesToIndex)

{
  string *psVar1;
  const_iterator cVar2;
  mapped_type_conflict1 *pmVar3;
  ostream *poVar4;
  runtime_error *this;
  stringstream ss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&mapCaffeLayerNamesToIndex->_M_t,(caffeLayer->name_).ptr_);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &(mapCaffeLayerNamesToIndex->_M_t)._M_impl.super__Rb_tree_header) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,"Caffe layer \'",0xd);
    psVar1 = (caffeLayer->name_).ptr_;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_190,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "\' is defined in the .prototxt file but is missing from the the .caffemodel file",
               0x4f);
    std::endl<char,std::char_traits<char>>(poVar4);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this,local_1c0);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::at(mapCaffeLayerNamesToIndex,(caffeLayer->name_).ptr_);
  if (-1 < *pmVar3) {
    return *pmVar3;
  }
  __assert_fail("l >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Utils-inl.hpp"
                ,0xaa,
                "int CoreMLConverter::getLayerIndex(const caffe::LayerParameter &, const std::map<std::string, int> &)"
               );
}

Assistant:

inline int getLayerIndex(const caffe::LayerParameter& caffeLayer,
                                             const std::map<std::string, int>& mapCaffeLayerNamesToIndex) {
        
        
        size_t layerIndexInWeightsFile = 0;
        if (mapCaffeLayerNamesToIndex.find(caffeLayer.name()) != mapCaffeLayerNamesToIndex.end()) {
            int l = mapCaffeLayerNamesToIndex.at(caffeLayer.name());
            assert(l >= 0);
            layerIndexInWeightsFile = static_cast<size_t>(l);
        } else {
            std::stringstream ss;
            ss << "Caffe layer '" << caffeLayer.name()
            << "' is defined in the .prototxt file but is missing from the the .caffemodel file" << std::endl;
            throw std::runtime_error(ss.str());
        }
        assert(layerIndexInWeightsFile <= INT_MAX);
        return static_cast<int>(layerIndexInWeightsFile);
        
    }